

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14PrivateFunctionMapFactory.cpp
# Opt level: O0

ElementFunctionMap *
COLLADASaxFWL14::FunctionMapFactory::createFunctionMap__library_controllers__allChildren(void)

{
  int iVar1;
  mapped_type *pmVar2;
  ElementValidateEndFunctionPtr in_R9;
  code *pcVar3;
  key_type *in_stack_ffffffffffffe0b8;
  map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
  *in_stack_ffffffffffffe0c0;
  code *this;
  FunctionStruct local_1e68;
  code *local_1e08;
  undefined8 uStack_1e00;
  code *local_1df8;
  undefined8 uStack_1df0;
  code *local_1de8;
  undefined8 uStack_1de0;
  code *local_1dd8;
  undefined8 uStack_1dd0;
  code *local_1dc8;
  undefined8 local_1dc0;
  code *local_1db8;
  undefined8 local_1db0;
  FunctionStruct local_1da8;
  code *local_1d48;
  undefined8 uStack_1d40;
  code *local_1d38;
  undefined8 uStack_1d30;
  code *local_1d28;
  undefined8 uStack_1d20;
  code *local_1d18;
  undefined8 uStack_1d10;
  code *local_1d08;
  undefined8 local_1d00;
  code *local_1cf8;
  undefined8 local_1cf0;
  FunctionStruct local_1ce8;
  code *local_1c88;
  undefined8 uStack_1c80;
  code *local_1c78;
  undefined8 uStack_1c70;
  code *local_1c68;
  undefined8 uStack_1c60;
  code *local_1c58;
  undefined8 uStack_1c50;
  code *local_1c48;
  undefined8 local_1c40;
  code *local_1c38;
  undefined8 local_1c30;
  FunctionStruct local_1c28;
  code *local_1bc8;
  undefined8 uStack_1bc0;
  code *local_1bb8;
  undefined8 uStack_1bb0;
  code *local_1ba8;
  undefined8 uStack_1ba0;
  code *local_1b98;
  undefined8 uStack_1b90;
  code *local_1b88;
  undefined8 local_1b80;
  code *local_1b78;
  undefined8 local_1b70;
  FunctionStruct local_1b68;
  code *local_1b08;
  undefined8 uStack_1b00;
  code *local_1af8;
  undefined8 uStack_1af0;
  code *local_1ae8;
  undefined8 uStack_1ae0;
  code *local_1ad8;
  undefined8 uStack_1ad0;
  code *local_1ac8;
  undefined8 local_1ac0;
  code *local_1ab8;
  undefined8 local_1ab0;
  FunctionStruct local_1aa8;
  code *local_1a48;
  undefined8 uStack_1a40;
  code *local_1a38;
  undefined8 uStack_1a30;
  code *local_1a28;
  undefined8 uStack_1a20;
  code *local_1a18;
  undefined8 uStack_1a10;
  code *local_1a08;
  undefined8 local_1a00;
  code *local_19f8;
  undefined8 local_19f0;
  FunctionStruct local_19e8;
  code *local_1988;
  undefined8 uStack_1980;
  code *local_1978;
  undefined8 uStack_1970;
  code *local_1968;
  undefined8 uStack_1960;
  code *local_1958;
  undefined8 uStack_1950;
  code *local_1948;
  undefined8 local_1940;
  code *local_1938;
  undefined8 local_1930;
  FunctionStruct local_1928;
  code *local_18c8;
  undefined8 uStack_18c0;
  code *local_18b8;
  undefined8 uStack_18b0;
  code *local_18a8;
  undefined8 uStack_18a0;
  code *local_1898;
  undefined8 uStack_1890;
  code *local_1888;
  undefined8 local_1880;
  code *local_1878;
  undefined8 local_1870;
  FunctionStruct local_1868;
  code *local_1808;
  undefined8 uStack_1800;
  code *local_17f8;
  undefined8 uStack_17f0;
  code *local_17e8;
  undefined8 uStack_17e0;
  code *local_17d8;
  undefined8 uStack_17d0;
  code *local_17c8;
  undefined8 local_17c0;
  code *local_17b8;
  undefined8 local_17b0;
  FunctionStruct local_17a8;
  code *local_1748;
  undefined8 uStack_1740;
  code *local_1738;
  undefined8 uStack_1730;
  code *local_1728;
  undefined8 uStack_1720;
  code *local_1718;
  undefined8 uStack_1710;
  code *local_1708;
  undefined8 local_1700;
  code *local_16f8;
  undefined8 local_16f0;
  FunctionStruct local_16e8;
  code *local_1688;
  undefined8 uStack_1680;
  code *local_1678;
  undefined8 uStack_1670;
  code *local_1668;
  undefined8 uStack_1660;
  code *local_1658;
  undefined8 uStack_1650;
  code *local_1648;
  undefined8 local_1640;
  code *local_1638;
  undefined8 local_1630;
  FunctionStruct local_1628;
  code *local_15c8;
  undefined8 uStack_15c0;
  code *local_15b8;
  undefined8 uStack_15b0;
  code *local_15a8;
  undefined8 uStack_15a0;
  code *local_1598;
  undefined8 uStack_1590;
  code *local_1588;
  undefined8 local_1580;
  code *local_1578;
  undefined8 local_1570;
  FunctionStruct local_1568;
  code *local_1508;
  undefined8 uStack_1500;
  code *local_14f8;
  undefined8 uStack_14f0;
  code *local_14e8;
  undefined8 uStack_14e0;
  code *local_14d8;
  undefined8 uStack_14d0;
  code *local_14c8;
  undefined8 local_14c0;
  code *local_14b8;
  undefined8 local_14b0;
  FunctionStruct local_14a8;
  code *local_1448;
  undefined8 uStack_1440;
  code *local_1438;
  undefined8 uStack_1430;
  code *local_1428;
  undefined8 uStack_1420;
  code *local_1418;
  undefined8 uStack_1410;
  code *local_1408;
  undefined8 local_1400;
  code *local_13f8;
  undefined8 local_13f0;
  FunctionStruct local_13e8;
  code *local_1388;
  undefined8 uStack_1380;
  code *local_1378;
  undefined8 uStack_1370;
  code *local_1368;
  undefined8 uStack_1360;
  code *local_1358;
  undefined8 uStack_1350;
  code *local_1348;
  undefined8 local_1340;
  code *local_1338;
  undefined8 local_1330;
  FunctionStruct local_1328;
  code *local_12c8;
  undefined8 uStack_12c0;
  code *local_12b8;
  undefined8 uStack_12b0;
  code *local_12a8;
  undefined8 uStack_12a0;
  code *local_1298;
  undefined8 uStack_1290;
  code *local_1288;
  undefined8 local_1280;
  code *local_1278;
  undefined8 local_1270;
  FunctionStruct local_1268;
  code *local_1208;
  undefined8 uStack_1200;
  code *local_11f8;
  undefined8 uStack_11f0;
  code *local_11e8;
  undefined8 uStack_11e0;
  code *local_11d8;
  undefined8 uStack_11d0;
  code *local_11c8;
  undefined8 local_11c0;
  code *local_11b8;
  undefined8 local_11b0;
  FunctionStruct local_11a8;
  code *local_1148;
  undefined8 uStack_1140;
  code *local_1138;
  undefined8 uStack_1130;
  code *local_1128;
  undefined8 uStack_1120;
  code *local_1118;
  undefined8 uStack_1110;
  code *local_1108;
  undefined8 local_1100;
  code *local_10f8;
  undefined8 local_10f0;
  FunctionStruct local_10e8;
  code *local_1088;
  undefined8 uStack_1080;
  code *local_1078;
  undefined8 uStack_1070;
  code *local_1068;
  undefined8 uStack_1060;
  code *local_1058;
  undefined8 uStack_1050;
  code *local_1048;
  undefined8 local_1040;
  code *local_1038;
  undefined8 local_1030;
  FunctionStruct local_1028;
  code *local_fc8;
  undefined8 uStack_fc0;
  code *local_fb8;
  undefined8 uStack_fb0;
  code *local_fa8;
  undefined8 uStack_fa0;
  code *local_f98;
  undefined8 uStack_f90;
  code *local_f88;
  undefined8 local_f80;
  code *local_f78;
  undefined8 local_f70;
  FunctionStruct local_f68;
  code *local_f08;
  undefined8 uStack_f00;
  code *local_ef8;
  undefined8 uStack_ef0;
  code *local_ee8;
  undefined8 uStack_ee0;
  code *local_ed8;
  undefined8 uStack_ed0;
  code *local_ec8;
  undefined8 local_ec0;
  map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
  *local_eb8;
  undefined8 local_eb0;
  FunctionStruct local_ea8;
  code *local_e48;
  undefined8 uStack_e40;
  code *local_e38;
  undefined8 uStack_e30;
  code *local_e28;
  undefined8 uStack_e20;
  code *local_e18;
  undefined8 uStack_e10;
  code *local_e08;
  undefined8 local_e00;
  code *local_df8;
  undefined8 local_df0;
  FunctionStruct local_de8;
  code *local_d88;
  undefined8 uStack_d80;
  code *local_d78;
  undefined8 uStack_d70;
  code *local_d68;
  undefined8 uStack_d60;
  code *local_d58;
  undefined8 uStack_d50;
  code *local_d48;
  undefined8 local_d40;
  code *local_d38;
  undefined8 local_d30;
  FunctionStruct local_d28;
  code *local_cc8;
  undefined8 uStack_cc0;
  code *local_cb8;
  undefined8 uStack_cb0;
  code *local_ca8;
  undefined8 uStack_ca0;
  code *local_c98;
  undefined8 uStack_c90;
  code *local_c88;
  undefined8 local_c80;
  code *local_c78;
  undefined8 local_c70;
  FunctionStruct local_c68;
  code *local_c08;
  undefined8 uStack_c00;
  code *local_bf8;
  undefined8 uStack_bf0;
  code *local_be8;
  undefined8 uStack_be0;
  code *local_bd8;
  undefined8 uStack_bd0;
  code *local_bc8;
  undefined8 local_bc0;
  code *local_bb8;
  undefined8 local_bb0;
  FunctionStruct local_ba8;
  code *local_b48;
  undefined8 uStack_b40;
  code *local_b38;
  undefined8 uStack_b30;
  code *local_b28;
  undefined8 uStack_b20;
  code *local_b18;
  undefined8 uStack_b10;
  code *local_b08;
  undefined8 local_b00;
  code *local_af8;
  undefined8 local_af0;
  FunctionStruct local_ae8;
  code *local_a88;
  undefined8 uStack_a80;
  code *local_a78;
  undefined8 uStack_a70;
  code *local_a68;
  undefined8 uStack_a60;
  code *local_a58;
  undefined8 uStack_a50;
  code *local_a48;
  undefined8 local_a40;
  code *local_a38;
  undefined8 local_a30;
  FunctionStruct local_a28;
  code *local_9c8;
  undefined8 uStack_9c0;
  code *local_9b8;
  undefined8 uStack_9b0;
  code *local_9a8;
  undefined8 uStack_9a0;
  code *local_998;
  undefined8 uStack_990;
  code *local_988;
  undefined8 local_980;
  code *local_978;
  undefined8 local_970;
  FunctionStruct local_968;
  code *local_908;
  undefined8 uStack_900;
  code *local_8f8;
  undefined8 uStack_8f0;
  code *local_8e8;
  undefined8 uStack_8e0;
  code *local_8d8;
  undefined8 uStack_8d0;
  code *local_8c8;
  undefined8 local_8c0;
  code *local_8b8;
  undefined8 local_8b0;
  FunctionStruct local_8a8;
  code *local_848;
  undefined8 uStack_840;
  code *local_838;
  undefined8 uStack_830;
  code *local_828;
  undefined8 uStack_820;
  code *local_818;
  undefined8 uStack_810;
  code *local_808;
  undefined8 local_800;
  code *local_7f8;
  undefined8 local_7f0;
  FunctionStruct local_7e8;
  code *local_788;
  undefined8 uStack_780;
  code *local_778;
  undefined8 uStack_770;
  code *local_768;
  undefined8 uStack_760;
  code *local_758;
  undefined8 uStack_750;
  code *local_748;
  undefined8 local_740;
  code *local_738;
  undefined8 local_730;
  FunctionStruct local_728;
  code *local_6c8;
  undefined8 uStack_6c0;
  code *local_6b8;
  undefined8 uStack_6b0;
  code *local_6a8;
  undefined8 uStack_6a0;
  code *local_698;
  undefined8 uStack_690;
  code *local_688;
  undefined8 local_680;
  code *local_678;
  undefined8 local_670;
  FunctionStruct local_668;
  code *local_608;
  undefined8 uStack_600;
  code *local_5f8;
  undefined8 uStack_5f0;
  code *local_5e8;
  undefined8 uStack_5e0;
  code *local_5d8;
  undefined8 uStack_5d0;
  code *local_5c8;
  undefined8 local_5c0;
  code *local_5b8;
  undefined8 local_5b0;
  FunctionStruct local_5a8;
  code *local_548;
  undefined8 uStack_540;
  code *local_538;
  undefined8 uStack_530;
  code *local_528;
  undefined8 uStack_520;
  code *local_518;
  undefined8 uStack_510;
  code *local_508;
  undefined8 local_500;
  code *local_4f8;
  undefined8 local_4f0;
  FunctionStruct local_4e8;
  code *local_488;
  undefined8 uStack_480;
  code *local_478;
  undefined8 uStack_470;
  code *local_468;
  undefined8 uStack_460;
  code *local_458;
  undefined8 uStack_450;
  code *local_448;
  undefined8 local_440;
  code *local_438;
  undefined8 local_430;
  FunctionStruct local_428;
  code *local_3c8;
  undefined8 uStack_3c0;
  code *local_3b8;
  undefined8 uStack_3b0;
  code *local_3a8;
  undefined8 uStack_3a0;
  code *local_398;
  undefined8 uStack_390;
  code *local_388;
  undefined8 local_380;
  code *local_378;
  undefined8 local_370;
  FunctionStruct local_368;
  code *local_308;
  undefined8 uStack_300;
  code *local_2f8;
  undefined8 uStack_2f0;
  code *local_2e8;
  undefined8 uStack_2e0;
  code *local_2d8;
  undefined8 uStack_2d0;
  code *local_2c8;
  undefined8 local_2c0;
  code *local_2b8;
  undefined8 local_2b0;
  FunctionStruct local_2a8;
  code *local_248;
  undefined8 uStack_240;
  code *local_238;
  undefined8 uStack_230;
  code *local_228;
  undefined8 uStack_220;
  code *local_218;
  undefined8 uStack_210;
  code *local_208;
  undefined8 local_200;
  code *local_1f8;
  undefined8 local_1f0;
  FunctionStruct local_1e8;
  code *local_188;
  undefined8 uStack_180;
  code *local_178;
  undefined8 uStack_170;
  code *local_168;
  undefined8 uStack_160;
  code *local_158;
  undefined8 uStack_150;
  code *local_148;
  undefined8 local_140;
  code *local_138;
  undefined8 local_130;
  FunctionStruct local_128;
  code *local_c8;
  undefined8 uStack_c0;
  code *local_b8;
  undefined8 uStack_b0;
  code *local_a8;
  undefined8 uStack_a0;
  code *local_98;
  undefined8 uStack_90;
  code *local_88;
  undefined8 local_80;
  code *local_78;
  undefined8 local_70;
  FunctionStruct local_68;
  
  if (createFunctionMap__library_controllers__allChildren()::functionMap == '\0') {
    iVar1 = __cxa_guard_acquire(&createFunctionMap__library_controllers__allChildren()::functionMap)
    ;
    if (iVar1 != 0) {
      std::
      map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
      ::map((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             *)0x7b626e);
      __cxa_atexit(std::
                   map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                   ::~map,&createFunctionMap__library_controllers__allChildren::functionMap,
                   &__dso_handle);
      __cxa_guard_release(&createFunctionMap__library_controllers__allChildren()::functionMap);
    }
  }
  if ((createFunctionMap__library_controllers__allChildren::mapFilled & 1U) == 0) {
    local_78 = ColladaParserAutoGen14Private::_begin__COLLADA;
    local_70 = 0;
    local_88 = ColladaParserAutoGen14Private::_data__COLLADA;
    local_80 = 0;
    local_98 = ColladaParserAutoGen14Private::_end__COLLADA;
    uStack_90 = 0;
    local_a8 = ColladaParserAutoGen14Private::_preBegin__COLLADA;
    uStack_a0 = 0;
    local_b8 = ColladaParserAutoGen14Private::_preEnd__COLLADA;
    uStack_b0 = 0;
    local_c8 = ColladaParserAutoGen14Private::_freeAttributes__COLLADA;
    uStack_c0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_68,0x84d880,0,0x85c460,0,in_R9,0x84d8b0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8);
    pmVar2->freeAttributesFunction = local_68.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_68._88_8_;
    pmVar2->validateEndFunction = local_68.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_68._72_8_;
    pmVar2->validateBeginFunction = local_68.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_68._56_8_;
    pmVar2->endFunction = local_68.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_68._40_8_;
    pmVar2->textDataFunction = local_68.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_68._24_8_;
    pmVar2->beginFunction = local_68.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_68._8_8_;
    local_138 = ColladaParserAutoGen14Private::_begin__library_controllers;
    local_130 = 0;
    local_148 = ColladaParserAutoGen14Private::_data__library_controllers;
    local_140 = 0;
    local_158 = ColladaParserAutoGen14Private::_end__library_controllers;
    uStack_150 = 0;
    local_168 = ColladaParserAutoGen14Private::_preBegin__library_controllers;
    uStack_160 = 0;
    local_178 = ColladaParserAutoGen14Private::_preEnd__library_controllers;
    uStack_170 = 0;
    local_188 = ColladaParserAutoGen14Private::_freeAttributes__library_controllers;
    uStack_180 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_128,0x84dc90,0,0x861f70,0,in_R9,0x84dcc0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8);
    pmVar2->freeAttributesFunction = local_128.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_128._88_8_;
    pmVar2->validateEndFunction = local_128.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_128._72_8_;
    pmVar2->validateBeginFunction = local_128.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_128._56_8_;
    pmVar2->endFunction = local_128.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_128._40_8_;
    pmVar2->textDataFunction = local_128.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_128._24_8_;
    pmVar2->beginFunction = local_128.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_128._8_8_;
    local_1f8 = ColladaParserAutoGen14Private::_begin__asset;
    local_1f0 = 0;
    local_208 = ColladaParserAutoGen14Private::_data__asset;
    local_200 = 0;
    local_218 = ColladaParserAutoGen14Private::_end__asset;
    uStack_210 = 0;
    local_228 = ColladaParserAutoGen14Private::_preBegin__asset;
    uStack_220 = 0;
    local_238 = ColladaParserAutoGen14Private::_preEnd__asset;
    uStack_230 = 0;
    local_248 = ColladaParserAutoGen14Private::_freeAttributes__asset;
    uStack_240 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_1e8,0x84db00,0,0x85ca40,0,in_R9,0x84db30);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8);
    pmVar2->freeAttributesFunction = local_1e8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1e8._88_8_;
    pmVar2->validateEndFunction = local_1e8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1e8._72_8_;
    pmVar2->validateBeginFunction = local_1e8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1e8._56_8_;
    pmVar2->endFunction = local_1e8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1e8._40_8_;
    pmVar2->textDataFunction = local_1e8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1e8._24_8_;
    pmVar2->beginFunction = local_1e8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1e8._8_8_;
    local_2b8 = ColladaParserAutoGen14Private::_begin__controller;
    local_2b0 = 0;
    local_2c8 = ColladaParserAutoGen14Private::_data__controller;
    local_2c0 = 0;
    local_2d8 = ColladaParserAutoGen14Private::_end__controller;
    uStack_2d0 = 0;
    local_2e8 = ColladaParserAutoGen14Private::_preBegin__controller;
    uStack_2e0 = 0;
    local_2f8 = ColladaParserAutoGen14Private::_preEnd__controller;
    uStack_2f0 = 0;
    local_308 = ColladaParserAutoGen14Private::_freeAttributes__controller;
    uStack_300 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_2a8,0x84e500,0,0x862100,0,in_R9,0x84e530);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[](in_stack_ffffffffffffe0c0,in_stack_ffffffffffffe0b8);
    pmVar2->freeAttributesFunction = local_2a8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_2a8._88_8_;
    pmVar2->validateEndFunction = local_2a8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_2a8._72_8_;
    pmVar2->validateBeginFunction = local_2a8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_2a8._56_8_;
    pmVar2->endFunction = local_2a8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_2a8._40_8_;
    pmVar2->textDataFunction = local_2a8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_2a8._24_8_;
    pmVar2->beginFunction = local_2a8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_2a8._8_8_;
    this = ColladaParserAutoGen14Private::_begin__extra;
    local_378 = ColladaParserAutoGen14Private::_begin__extra;
    local_370 = 0;
    local_388 = ColladaParserAutoGen14Private::_data__extra;
    local_380 = 0;
    local_398 = ColladaParserAutoGen14Private::_end__extra;
    uStack_390 = 0;
    local_3a8 = ColladaParserAutoGen14Private::_preBegin__extra;
    uStack_3a0 = 0;
    local_3b8 = ColladaParserAutoGen14Private::_preEnd__extra;
    uStack_3b0 = 0;
    local_3c8 = ColladaParserAutoGen14Private::_freeAttributes__extra;
    uStack_3c0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_368,0x84db50,0,0x85fb30,0,in_R9,0x84db80);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,in_stack_ffffffffffffe0b8);
    pmVar2->freeAttributesFunction = local_368.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_368._88_8_;
    pmVar2->validateEndFunction = local_368.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_368._72_8_;
    pmVar2->validateBeginFunction = local_368.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_368._56_8_;
    pmVar2->endFunction = local_368.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_368._40_8_;
    pmVar2->textDataFunction = local_368.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_368._24_8_;
    pmVar2->beginFunction = local_368.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_368._8_8_;
    local_438 = ColladaParserAutoGen14Private::_begin__contributor;
    local_430 = 0;
    local_448 = ColladaParserAutoGen14Private::_data__contributor;
    local_440 = 0;
    local_458 = ColladaParserAutoGen14Private::_end__contributor;
    uStack_450 = 0;
    local_468 = ColladaParserAutoGen14Private::_preBegin__contributor;
    uStack_460 = 0;
    local_478 = ColladaParserAutoGen14Private::_preEnd__contributor;
    uStack_470 = 0;
    local_488 = ColladaParserAutoGen14Private::_freeAttributes__contributor;
    uStack_480 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_428,0x850350,0,0x85caa0,0,in_R9,0x850380);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,in_stack_ffffffffffffe0b8);
    pmVar2->freeAttributesFunction = local_428.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_428._88_8_;
    pmVar2->validateEndFunction = local_428.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_428._72_8_;
    pmVar2->validateBeginFunction = local_428.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_428._56_8_;
    pmVar2->endFunction = local_428.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_428._40_8_;
    pmVar2->textDataFunction = local_428.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_428._24_8_;
    pmVar2->beginFunction = local_428.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_428._8_8_;
    local_4f8 = ColladaParserAutoGen14Private::_begin__created;
    local_4f0 = 0;
    local_508 = ColladaParserAutoGen14Private::_data__created;
    local_500 = 0;
    local_518 = ColladaParserAutoGen14Private::_end__created;
    uStack_510 = 0;
    local_528 = ColladaParserAutoGen14Private::_preBegin__created;
    uStack_520 = 0;
    local_538 = ColladaParserAutoGen14Private::_preEnd__created;
    uStack_530 = 0;
    local_548 = ColladaParserAutoGen14Private::_freeAttributes__created;
    uStack_540 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_4e8,0x8503a0,0,0x85cfe0,0,in_R9,0x8503d0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,in_stack_ffffffffffffe0b8);
    pmVar2->freeAttributesFunction = local_4e8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_4e8._88_8_;
    pmVar2->validateEndFunction = local_4e8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_4e8._72_8_;
    pmVar2->validateBeginFunction = local_4e8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_4e8._56_8_;
    pmVar2->endFunction = local_4e8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_4e8._40_8_;
    pmVar2->textDataFunction = local_4e8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_4e8._24_8_;
    pmVar2->beginFunction = local_4e8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_4e8._8_8_;
    local_5b8 = ColladaParserAutoGen14Private::_begin__keywords;
    local_5b0 = 0;
    local_5c8 = ColladaParserAutoGen14Private::_data__keywords;
    local_5c0 = 0;
    local_5d8 = ColladaParserAutoGen14Private::_end__keywords;
    uStack_5d0 = 0;
    local_5e8 = ColladaParserAutoGen14Private::_preBegin__keywords;
    uStack_5e0 = 0;
    local_5f8 = ColladaParserAutoGen14Private::_preEnd__keywords;
    uStack_5f0 = 0;
    local_608 = ColladaParserAutoGen14Private::_freeAttributes__keywords;
    uStack_600 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_5a8,0x8503f0,0,0x85d060,0,in_R9,0x850420);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,in_stack_ffffffffffffe0b8);
    pmVar2->freeAttributesFunction = local_5a8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_5a8._88_8_;
    pmVar2->validateEndFunction = local_5a8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_5a8._72_8_;
    pmVar2->validateBeginFunction = local_5a8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_5a8._56_8_;
    pmVar2->endFunction = local_5a8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_5a8._40_8_;
    pmVar2->textDataFunction = local_5a8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_5a8._24_8_;
    pmVar2->beginFunction = local_5a8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_5a8._8_8_;
    local_678 = ColladaParserAutoGen14Private::_begin__modified;
    local_670 = 0;
    local_688 = ColladaParserAutoGen14Private::_data__modified;
    local_680 = 0;
    local_698 = ColladaParserAutoGen14Private::_end__modified;
    uStack_690 = 0;
    local_6a8 = ColladaParserAutoGen14Private::_preBegin__modified;
    uStack_6a0 = 0;
    local_6b8 = ColladaParserAutoGen14Private::_preEnd__modified;
    uStack_6b0 = 0;
    local_6c8 = ColladaParserAutoGen14Private::_freeAttributes__modified;
    uStack_6c0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_668,0x850440,0,0x85d0e0,0,in_R9,0x850470);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,in_stack_ffffffffffffe0b8);
    pmVar2->freeAttributesFunction = local_668.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_668._88_8_;
    pmVar2->validateEndFunction = local_668.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_668._72_8_;
    pmVar2->validateBeginFunction = local_668.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_668._56_8_;
    pmVar2->endFunction = local_668.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_668._40_8_;
    pmVar2->textDataFunction = local_668.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_668._24_8_;
    pmVar2->beginFunction = local_668.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_668._8_8_;
    local_738 = ColladaParserAutoGen14Private::_begin__revision;
    local_730 = 0;
    local_748 = ColladaParserAutoGen14Private::_data__revision;
    local_740 = 0;
    local_758 = ColladaParserAutoGen14Private::_end__revision;
    uStack_750 = 0;
    local_768 = ColladaParserAutoGen14Private::_preBegin__revision;
    uStack_760 = 0;
    local_778 = ColladaParserAutoGen14Private::_preEnd__revision;
    uStack_770 = 0;
    local_788 = ColladaParserAutoGen14Private::_freeAttributes__revision;
    uStack_780 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_728,0x850490,0,0x85d160,0,in_R9,0x8504c0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,in_stack_ffffffffffffe0b8);
    pmVar2->freeAttributesFunction = local_728.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_728._88_8_;
    pmVar2->validateEndFunction = local_728.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_728._72_8_;
    pmVar2->validateBeginFunction = local_728.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_728._56_8_;
    pmVar2->endFunction = local_728.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_728._40_8_;
    pmVar2->textDataFunction = local_728.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_728._24_8_;
    pmVar2->beginFunction = local_728.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_728._8_8_;
    local_7f8 = ColladaParserAutoGen14Private::_begin__subject;
    local_7f0 = 0;
    local_808 = ColladaParserAutoGen14Private::_data__subject;
    local_800 = 0;
    local_818 = ColladaParserAutoGen14Private::_end__subject;
    uStack_810 = 0;
    local_828 = ColladaParserAutoGen14Private::_preBegin__subject;
    uStack_820 = 0;
    local_838 = ColladaParserAutoGen14Private::_preEnd__subject;
    uStack_830 = 0;
    local_848 = ColladaParserAutoGen14Private::_freeAttributes__subject;
    uStack_840 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_7e8,0x8504e0,0,0x85d1e0,0,in_R9,0x850510);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,in_stack_ffffffffffffe0b8);
    pmVar2->freeAttributesFunction = local_7e8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_7e8._88_8_;
    pmVar2->validateEndFunction = local_7e8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_7e8._72_8_;
    pmVar2->validateBeginFunction = local_7e8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_7e8._56_8_;
    pmVar2->endFunction = local_7e8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_7e8._40_8_;
    pmVar2->textDataFunction = local_7e8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_7e8._24_8_;
    pmVar2->beginFunction = local_7e8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_7e8._8_8_;
    local_8b8 = ColladaParserAutoGen14Private::_begin__title;
    local_8b0 = 0;
    local_8c8 = ColladaParserAutoGen14Private::_data__title;
    local_8c0 = 0;
    local_8d8 = ColladaParserAutoGen14Private::_end__title;
    uStack_8d0 = 0;
    local_8e8 = ColladaParserAutoGen14Private::_preBegin__title;
    uStack_8e0 = 0;
    local_8f8 = ColladaParserAutoGen14Private::_preEnd__title;
    uStack_8f0 = 0;
    local_908 = ColladaParserAutoGen14Private::_freeAttributes__title;
    uStack_900 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_8a8,0x850530,0,0x85d260,0,in_R9,0x850560);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,in_stack_ffffffffffffe0b8);
    pmVar2->freeAttributesFunction = local_8a8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_8a8._88_8_;
    pmVar2->validateEndFunction = local_8a8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_8a8._72_8_;
    pmVar2->validateBeginFunction = local_8a8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_8a8._56_8_;
    pmVar2->endFunction = local_8a8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_8a8._40_8_;
    pmVar2->textDataFunction = local_8a8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_8a8._24_8_;
    pmVar2->beginFunction = local_8a8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_8a8._8_8_;
    local_978 = ColladaParserAutoGen14Private::_begin__unit;
    local_970 = 0;
    local_988 = ColladaParserAutoGen14Private::_data__unit;
    local_980 = 0;
    local_998 = ColladaParserAutoGen14Private::_end__unit;
    uStack_990 = 0;
    local_9a8 = ColladaParserAutoGen14Private::_preBegin__unit;
    uStack_9a0 = 0;
    local_9b8 = ColladaParserAutoGen14Private::_preEnd__unit;
    uStack_9b0 = 0;
    local_9c8 = ColladaParserAutoGen14Private::_freeAttributes__unit;
    uStack_9c0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_968,0x850580,0,0x85d2e0,0,in_R9,0x8505b0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,in_stack_ffffffffffffe0b8);
    pmVar2->freeAttributesFunction = local_968.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_968._88_8_;
    pmVar2->validateEndFunction = local_968.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_968._72_8_;
    pmVar2->validateBeginFunction = local_968.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_968._56_8_;
    pmVar2->endFunction = local_968.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_968._40_8_;
    pmVar2->textDataFunction = local_968.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_968._24_8_;
    pmVar2->beginFunction = local_968.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_968._8_8_;
    local_a38 = ColladaParserAutoGen14Private::_begin__up_axis;
    local_a30 = 0;
    local_a48 = ColladaParserAutoGen14Private::_data__up_axis;
    local_a40 = 0;
    local_a58 = ColladaParserAutoGen14Private::_end__up_axis;
    uStack_a50 = 0;
    local_a68 = ColladaParserAutoGen14Private::_preBegin__up_axis;
    uStack_a60 = 0;
    local_a78 = ColladaParserAutoGen14Private::_preEnd__up_axis;
    uStack_a70 = 0;
    local_a88 = ColladaParserAutoGen14Private::_freeAttributes__up_axis;
    uStack_a80 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_a28,0x8505d0,0,0x85d4b0,0,in_R9,0x850600);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,in_stack_ffffffffffffe0b8);
    pmVar2->freeAttributesFunction = local_a28.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_a28._88_8_;
    pmVar2->validateEndFunction = local_a28.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_a28._72_8_;
    pmVar2->validateBeginFunction = local_a28.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_a28._56_8_;
    pmVar2->endFunction = local_a28.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_a28._40_8_;
    pmVar2->textDataFunction = local_a28.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_a28._24_8_;
    pmVar2->beginFunction = local_a28.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_a28._8_8_;
    local_af8 = ColladaParserAutoGen14Private::_begin__author;
    local_af0 = 0;
    local_b08 = ColladaParserAutoGen14Private::_data__author;
    local_b00 = 0;
    local_b18 = ColladaParserAutoGen14Private::_end__author;
    uStack_b10 = 0;
    local_b28 = ColladaParserAutoGen14Private::_preBegin__author;
    uStack_b20 = 0;
    local_b38 = ColladaParserAutoGen14Private::_preEnd__author;
    uStack_b30 = 0;
    local_b48 = ColladaParserAutoGen14Private::_freeAttributes__author;
    uStack_b40 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_ae8,0x850620,0,0x85cb00,0,in_R9,0x850650);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,in_stack_ffffffffffffe0b8);
    pmVar2->freeAttributesFunction = local_ae8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_ae8._88_8_;
    pmVar2->validateEndFunction = local_ae8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_ae8._72_8_;
    pmVar2->validateBeginFunction = local_ae8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_ae8._56_8_;
    pmVar2->endFunction = local_ae8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_ae8._40_8_;
    pmVar2->textDataFunction = local_ae8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_ae8._24_8_;
    pmVar2->beginFunction = local_ae8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_ae8._8_8_;
    local_bb8 = ColladaParserAutoGen14Private::_begin__authoring_tool;
    local_bb0 = 0;
    local_bc8 = ColladaParserAutoGen14Private::_data__authoring_tool;
    local_bc0 = 0;
    local_bd8 = ColladaParserAutoGen14Private::_end__authoring_tool;
    uStack_bd0 = 0;
    local_be8 = ColladaParserAutoGen14Private::_preBegin__authoring_tool;
    uStack_be0 = 0;
    local_bf8 = ColladaParserAutoGen14Private::_preEnd__authoring_tool;
    uStack_bf0 = 0;
    local_c08 = ColladaParserAutoGen14Private::_freeAttributes__authoring_tool;
    uStack_c00 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_ba8,0x850670,0,0x85cb80,0,in_R9,0x8506a0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,in_stack_ffffffffffffe0b8);
    pmVar2->freeAttributesFunction = local_ba8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_ba8._88_8_;
    pmVar2->validateEndFunction = local_ba8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_ba8._72_8_;
    pmVar2->validateBeginFunction = local_ba8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_ba8._56_8_;
    pmVar2->endFunction = local_ba8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_ba8._40_8_;
    pmVar2->textDataFunction = local_ba8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_ba8._24_8_;
    pmVar2->beginFunction = local_ba8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_ba8._8_8_;
    local_c78 = ColladaParserAutoGen14Private::_begin__comments;
    local_c70 = 0;
    local_c88 = ColladaParserAutoGen14Private::_data__comments;
    local_c80 = 0;
    local_c98 = ColladaParserAutoGen14Private::_end__comments;
    uStack_c90 = 0;
    local_ca8 = ColladaParserAutoGen14Private::_preBegin__comments;
    uStack_ca0 = 0;
    local_cb8 = ColladaParserAutoGen14Private::_preEnd__comments;
    uStack_cb0 = 0;
    local_cc8 = ColladaParserAutoGen14Private::_freeAttributes__comments;
    uStack_cc0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_c68,0x8506c0,0,0x85cc00,0,in_R9,0x8506f0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,in_stack_ffffffffffffe0b8);
    pmVar2->freeAttributesFunction = local_c68.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_c68._88_8_;
    pmVar2->validateEndFunction = local_c68.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_c68._72_8_;
    pmVar2->validateBeginFunction = local_c68.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_c68._56_8_;
    pmVar2->endFunction = local_c68.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_c68._40_8_;
    pmVar2->textDataFunction = local_c68.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_c68._24_8_;
    pmVar2->beginFunction = local_c68.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_c68._8_8_;
    local_d38 = ColladaParserAutoGen14Private::_begin__copyright;
    local_d30 = 0;
    local_d48 = ColladaParserAutoGen14Private::_data__copyright;
    local_d40 = 0;
    local_d58 = ColladaParserAutoGen14Private::_end__copyright;
    uStack_d50 = 0;
    local_d68 = ColladaParserAutoGen14Private::_preBegin__copyright;
    uStack_d60 = 0;
    local_d78 = ColladaParserAutoGen14Private::_preEnd__copyright;
    uStack_d70 = 0;
    local_d88 = ColladaParserAutoGen14Private::_freeAttributes__copyright;
    uStack_d80 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_d28,0x850710,0,0x85cc80,0,in_R9,0x850740);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,in_stack_ffffffffffffe0b8);
    pmVar2->freeAttributesFunction = local_d28.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_d28._88_8_;
    pmVar2->validateEndFunction = local_d28.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_d28._72_8_;
    pmVar2->validateBeginFunction = local_d28.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_d28._56_8_;
    pmVar2->endFunction = local_d28.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_d28._40_8_;
    pmVar2->textDataFunction = local_d28.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_d28._24_8_;
    pmVar2->beginFunction = local_d28.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_d28._8_8_;
    local_df8 = ColladaParserAutoGen14Private::_begin__source_data;
    local_df0 = 0;
    local_e08 = ColladaParserAutoGen14Private::_data__source_data;
    local_e00 = 0;
    local_e18 = ColladaParserAutoGen14Private::_end__source_data;
    uStack_e10 = 0;
    local_e28 = ColladaParserAutoGen14Private::_preBegin__source_data;
    uStack_e20 = 0;
    local_e38 = ColladaParserAutoGen14Private::_preEnd__source_data;
    uStack_e30 = 0;
    local_e48 = ColladaParserAutoGen14Private::_freeAttributes__source_data;
    uStack_e40 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_de8,0x850760,0,0x85cd00,0,in_R9,0x850790);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,in_stack_ffffffffffffe0b8);
    pcVar3 = ColladaParserAutoGen14Private::_preBegin__extra;
    pmVar2->freeAttributesFunction = local_de8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_de8._88_8_;
    pmVar2->validateEndFunction = local_de8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_de8._72_8_;
    pmVar2->validateBeginFunction = local_de8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_de8._56_8_;
    pmVar2->endFunction = local_de8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_de8._40_8_;
    pmVar2->textDataFunction = local_de8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_de8._24_8_;
    pmVar2->beginFunction = local_de8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_de8._8_8_;
    local_eb0 = 0;
    local_ec8 = ColladaParserAutoGen14Private::_data__extra;
    local_ec0 = 0;
    local_ed8 = ColladaParserAutoGen14Private::_end__extra;
    uStack_ed0 = 0;
    local_ee8 = ColladaParserAutoGen14Private::_preBegin__extra;
    uStack_ee0 = 0;
    local_ef8 = ColladaParserAutoGen14Private::_preEnd__extra;
    uStack_ef0 = 0;
    local_f08 = ColladaParserAutoGen14Private::_freeAttributes__extra;
    uStack_f00 = 0;
    local_eb8 = (map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                 *)this;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_ea8,(ElementBeginFunctionPtr)this,0,0x85fb30,0,0x85fb50,0x84db80);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,in_stack_ffffffffffffe0b8);
    pmVar2->freeAttributesFunction = local_ea8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_ea8._88_8_;
    pmVar2->validateEndFunction = local_ea8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_ea8._72_8_;
    pmVar2->validateBeginFunction = local_ea8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_ea8._56_8_;
    pmVar2->endFunction = local_ea8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_ea8._40_8_;
    pmVar2->textDataFunction = local_ea8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_ea8._24_8_;
    pmVar2->beginFunction = local_ea8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_ea8._8_8_;
    local_f78 = ColladaParserAutoGen14Private::_begin__morph;
    local_f70 = 0;
    local_f88 = ColladaParserAutoGen14Private::_data__morph;
    local_f80 = 0;
    local_f98 = ColladaParserAutoGen14Private::_end__morph;
    uStack_f90 = 0;
    local_fa8 = ColladaParserAutoGen14Private::_preBegin__morph;
    uStack_fa0 = 0;
    local_fb8 = ColladaParserAutoGen14Private::_preEnd__morph;
    uStack_fb0 = 0;
    local_fc8 = ColladaParserAutoGen14Private::_freeAttributes__morph;
    uStack_fc0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_f68,0x84eff0,0,0x862dd0,0,(ElementValidateEndFunctionPtr)pcVar3,0x84f020);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,in_stack_ffffffffffffe0b8);
    pmVar2->freeAttributesFunction = local_f68.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_f68._88_8_;
    pmVar2->validateEndFunction = local_f68.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_f68._72_8_;
    pmVar2->validateBeginFunction = local_f68.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_f68._56_8_;
    pmVar2->endFunction = local_f68.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_f68._40_8_;
    pmVar2->textDataFunction = local_f68.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_f68._24_8_;
    pmVar2->beginFunction = local_f68.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_f68._8_8_;
    local_1038 = ColladaParserAutoGen14Private::_begin__skin;
    local_1030 = 0;
    local_1048 = ColladaParserAutoGen14Private::_data__skin;
    local_1040 = 0;
    local_1058 = ColladaParserAutoGen14Private::_end__skin;
    uStack_1050 = 0;
    local_1068 = ColladaParserAutoGen14Private::_preBegin__skin;
    uStack_1060 = 0;
    local_1078 = ColladaParserAutoGen14Private::_preEnd__skin;
    uStack_1070 = 0;
    local_1088 = ColladaParserAutoGen14Private::_freeAttributes__skin;
    uStack_1080 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_1028,0x84f9a0,0,0x862290,0,(ElementValidateEndFunctionPtr)pcVar3,0x84f9d0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,in_stack_ffffffffffffe0b8);
    pmVar2->freeAttributesFunction = local_1028.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1028._88_8_;
    pmVar2->validateEndFunction = local_1028.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1028._72_8_;
    pmVar2->validateBeginFunction = local_1028.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1028._56_8_;
    pmVar2->endFunction = local_1028.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1028._40_8_;
    pmVar2->textDataFunction = local_1028.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1028._24_8_;
    pmVar2->beginFunction = local_1028.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1028._8_8_;
    local_10f8 = ColladaParserAutoGen14Private::_begin__technique;
    local_10f0 = 0;
    local_1108 = ColladaParserAutoGen14Private::_data__technique;
    local_1100 = 0;
    local_1118 = ColladaParserAutoGen14Private::_end__technique;
    uStack_1110 = 0;
    local_1128 = ColladaParserAutoGen14Private::_preBegin__technique;
    uStack_1120 = 0;
    local_1138 = ColladaParserAutoGen14Private::_preEnd__technique;
    uStack_1130 = 0;
    local_1148 = ColladaParserAutoGen14Private::_freeAttributes__technique;
    uStack_1140 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_10e8,0x8507b0,0,0x85f410,0,(ElementValidateEndFunctionPtr)pcVar3,0x8507e0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,in_stack_ffffffffffffe0b8);
    pmVar2->freeAttributesFunction = local_10e8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_10e8._88_8_;
    pmVar2->validateEndFunction = local_10e8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_10e8._72_8_;
    pmVar2->validateBeginFunction = local_10e8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_10e8._56_8_;
    pmVar2->endFunction = local_10e8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_10e8._40_8_;
    pmVar2->textDataFunction = local_10e8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_10e8._24_8_;
    pmVar2->beginFunction = local_10e8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_10e8._8_8_;
    local_11b8 = ColladaParserAutoGen14Private::_begin__source;
    local_11b0 = 0;
    local_11c8 = ColladaParserAutoGen14Private::_data__source;
    local_11c0 = 0;
    local_11d8 = ColladaParserAutoGen14Private::_end__source;
    uStack_11d0 = 0;
    local_11e8 = ColladaParserAutoGen14Private::_preBegin__source;
    uStack_11e0 = 0;
    local_11f8 = ColladaParserAutoGen14Private::_preEnd__source;
    uStack_11f0 = 0;
    local_1208 = ColladaParserAutoGen14Private::_freeAttributes__source;
    uStack_1200 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_11a8,0x84f9f0,0,0x85dbb0,0,(ElementValidateEndFunctionPtr)pcVar3,0x84fa20);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,in_stack_ffffffffffffe0b8);
    pmVar2->freeAttributesFunction = local_11a8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_11a8._88_8_;
    pmVar2->validateEndFunction = local_11a8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_11a8._72_8_;
    pmVar2->validateBeginFunction = local_11a8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_11a8._56_8_;
    pmVar2->endFunction = local_11a8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_11a8._40_8_;
    pmVar2->textDataFunction = local_11a8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_11a8._24_8_;
    pmVar2->beginFunction = local_11a8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_11a8._8_8_;
    local_1278 = ColladaParserAutoGen14Private::_begin__targets;
    local_1270 = 0;
    local_1288 = ColladaParserAutoGen14Private::_data__targets;
    local_1280 = 0;
    local_1298 = ColladaParserAutoGen14Private::_end__targets;
    uStack_1290 = 0;
    local_12a8 = ColladaParserAutoGen14Private::_preBegin__targets;
    uStack_12a0 = 0;
    local_12b8 = ColladaParserAutoGen14Private::_preEnd__targets;
    uStack_12b0 = 0;
    local_12c8 = ColladaParserAutoGen14Private::_freeAttributes__targets;
    uStack_12c0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_1268,0x84fc20,0,0x863370,0,(ElementValidateEndFunctionPtr)pcVar3,0x84fc50);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,in_stack_ffffffffffffe0b8);
    pmVar2->freeAttributesFunction = local_1268.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1268._88_8_;
    pmVar2->validateEndFunction = local_1268.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1268._72_8_;
    pmVar2->validateBeginFunction = local_1268.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1268._56_8_;
    pmVar2->endFunction = local_1268.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1268._40_8_;
    pmVar2->textDataFunction = local_1268.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1268._24_8_;
    pmVar2->beginFunction = local_1268.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1268._8_8_;
    local_1338 = ColladaParserAutoGen14Private::_begin__IDREF_array;
    local_1330 = 0;
    local_1348 = ColladaParserAutoGen14Private::_data__IDREF_array;
    local_1340 = 0;
    local_1358 = ColladaParserAutoGen14Private::_end__IDREF_array;
    uStack_1350 = 0;
    local_1368 = ColladaParserAutoGen14Private::_preBegin__IDREF_array;
    uStack_1360 = 0;
    local_1378 = ColladaParserAutoGen14Private::_preEnd__IDREF_array;
    uStack_1370 = 0;
    local_1388 = ColladaParserAutoGen14Private::_freeAttributes__IDREF_array;
    uStack_1380 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_1328,0x8508f0,0,0x85dd80,0,(ElementValidateEndFunctionPtr)pcVar3,0x850920);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,in_stack_ffffffffffffe0b8);
    pmVar2->freeAttributesFunction = local_1328.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1328._88_8_;
    pmVar2->validateEndFunction = local_1328.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1328._72_8_;
    pmVar2->validateBeginFunction = local_1328.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1328._56_8_;
    pmVar2->endFunction = local_1328.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1328._40_8_;
    pmVar2->textDataFunction = local_1328.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1328._24_8_;
    pmVar2->beginFunction = local_1328.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1328._8_8_;
    local_13f8 = ColladaParserAutoGen14Private::_begin__Name_array;
    local_13f0 = 0;
    local_1408 = ColladaParserAutoGen14Private::_data__Name_array;
    local_1400 = 0;
    local_1418 = ColladaParserAutoGen14Private::_end__Name_array;
    uStack_1410 = 0;
    local_1428 = ColladaParserAutoGen14Private::_preBegin__Name_array;
    uStack_1420 = 0;
    local_1438 = ColladaParserAutoGen14Private::_preEnd__Name_array;
    uStack_1430 = 0;
    local_1448 = ColladaParserAutoGen14Private::_freeAttributes__Name_array;
    uStack_1440 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_13e8,0x850940,0,0x85e030,0,(ElementValidateEndFunctionPtr)pcVar3,0x850970);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,in_stack_ffffffffffffe0b8);
    pmVar2->freeAttributesFunction = local_13e8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_13e8._88_8_;
    pmVar2->validateEndFunction = local_13e8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_13e8._72_8_;
    pmVar2->validateBeginFunction = local_13e8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_13e8._56_8_;
    pmVar2->endFunction = local_13e8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_13e8._40_8_;
    pmVar2->textDataFunction = local_13e8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_13e8._24_8_;
    pmVar2->beginFunction = local_13e8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_13e8._8_8_;
    local_14b8 = ColladaParserAutoGen14Private::_begin__bool_array;
    local_14b0 = 0;
    local_14c8 = ColladaParserAutoGen14Private::_data__bool_array;
    local_14c0 = 0;
    local_14d8 = ColladaParserAutoGen14Private::_end__bool_array;
    uStack_14d0 = 0;
    local_14e8 = ColladaParserAutoGen14Private::_preBegin__bool_array;
    uStack_14e0 = 0;
    local_14f8 = ColladaParserAutoGen14Private::_preEnd__bool_array;
    uStack_14f0 = 0;
    local_1508 = ColladaParserAutoGen14Private::_freeAttributes__bool_array;
    uStack_1500 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_14a8,0x850990,0,0x85e2e0,0,(ElementValidateEndFunctionPtr)pcVar3,0x8509c0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,in_stack_ffffffffffffe0b8);
    pmVar2->freeAttributesFunction = local_14a8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_14a8._88_8_;
    pmVar2->validateEndFunction = local_14a8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_14a8._72_8_;
    pmVar2->validateBeginFunction = local_14a8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_14a8._56_8_;
    pmVar2->endFunction = local_14a8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_14a8._40_8_;
    pmVar2->textDataFunction = local_14a8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_14a8._24_8_;
    pmVar2->beginFunction = local_14a8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_14a8._8_8_;
    local_1578 = ColladaParserAutoGen14Private::_begin__float_array;
    local_1570 = 0;
    local_1588 = ColladaParserAutoGen14Private::_data__float_array;
    local_1580 = 0;
    local_1598 = ColladaParserAutoGen14Private::_end__float_array;
    uStack_1590 = 0;
    local_15a8 = ColladaParserAutoGen14Private::_preBegin__float_array;
    uStack_15a0 = 0;
    local_15b8 = ColladaParserAutoGen14Private::_preEnd__float_array;
    uStack_15b0 = 0;
    local_15c8 = ColladaParserAutoGen14Private::_freeAttributes__float_array;
    uStack_15c0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_1568,0x8509e0,0,0x85e590,0,(ElementValidateEndFunctionPtr)pcVar3,0x850a10);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,in_stack_ffffffffffffe0b8);
    pmVar2->freeAttributesFunction = local_1568.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1568._88_8_;
    pmVar2->validateEndFunction = local_1568.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1568._72_8_;
    pmVar2->validateBeginFunction = local_1568.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1568._56_8_;
    pmVar2->endFunction = local_1568.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1568._40_8_;
    pmVar2->textDataFunction = local_1568.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1568._24_8_;
    pmVar2->beginFunction = local_1568.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1568._8_8_;
    local_1638 = ColladaParserAutoGen14Private::_begin__int_array;
    local_1630 = 0;
    local_1648 = ColladaParserAutoGen14Private::_data__int_array;
    local_1640 = 0;
    local_1658 = ColladaParserAutoGen14Private::_end__int_array;
    uStack_1650 = 0;
    local_1668 = ColladaParserAutoGen14Private::_preBegin__int_array;
    uStack_1660 = 0;
    local_1678 = ColladaParserAutoGen14Private::_preEnd__int_array;
    uStack_1670 = 0;
    local_1688 = ColladaParserAutoGen14Private::_freeAttributes__int_array;
    uStack_1680 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_1628,0x850a30,0,0x85e910,0,(ElementValidateEndFunctionPtr)pcVar3,0x850a60);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,in_stack_ffffffffffffe0b8);
    pmVar2->freeAttributesFunction = local_1628.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1628._88_8_;
    pmVar2->validateEndFunction = local_1628.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1628._72_8_;
    pmVar2->validateBeginFunction = local_1628.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1628._56_8_;
    pmVar2->endFunction = local_1628.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1628._40_8_;
    pmVar2->textDataFunction = local_1628.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1628._24_8_;
    pmVar2->beginFunction = local_1628.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1628._8_8_;
    local_16f8 = ColladaParserAutoGen14Private::_begin__animation__source__technique_common;
    local_16f0 = 0;
    local_1708 = ColladaParserAutoGen14Private::_data__animation__source__technique_common;
    local_1700 = 0;
    local_1718 = ColladaParserAutoGen14Private::_end__animation__source__technique_common;
    uStack_1710 = 0;
    local_1728 = ColladaParserAutoGen14Private::_preBegin__animation__source__technique_common;
    uStack_1720 = 0;
    local_1738 = ColladaParserAutoGen14Private::_preEnd__animation__source__technique_common;
    uStack_1730 = 0;
    local_1748 = ColladaParserAutoGen14Private::_freeAttributes__animation__source__technique_common
    ;
    uStack_1740 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_16e8,0x850a80,0,0x85ec90,0,(ElementValidateEndFunctionPtr)pcVar3,0x850ab0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,in_stack_ffffffffffffe0b8);
    pmVar2->freeAttributesFunction = local_16e8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_16e8._88_8_;
    pmVar2->validateEndFunction = local_16e8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_16e8._72_8_;
    pmVar2->validateBeginFunction = local_16e8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_16e8._56_8_;
    pmVar2->endFunction = local_16e8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_16e8._40_8_;
    pmVar2->textDataFunction = local_16e8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_16e8._24_8_;
    pmVar2->beginFunction = local_16e8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_16e8._8_8_;
    local_17b8 = ColladaParserAutoGen14Private::_begin__accessor;
    local_17b0 = 0;
    local_17c8 = ColladaParserAutoGen14Private::_data__accessor;
    local_17c0 = 0;
    local_17d8 = ColladaParserAutoGen14Private::_end__accessor;
    uStack_17d0 = 0;
    local_17e8 = ColladaParserAutoGen14Private::_preBegin__accessor;
    uStack_17e0 = 0;
    local_17f8 = ColladaParserAutoGen14Private::_preEnd__accessor;
    uStack_17f0 = 0;
    local_1808 = ColladaParserAutoGen14Private::_freeAttributes__accessor;
    uStack_1800 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_17a8,0x850ad0,0,0x85ecf0,0,(ElementValidateEndFunctionPtr)pcVar3,0x850b00);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,in_stack_ffffffffffffe0b8);
    pmVar2->freeAttributesFunction = local_17a8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_17a8._88_8_;
    pmVar2->validateEndFunction = local_17a8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_17a8._72_8_;
    pmVar2->validateBeginFunction = local_17a8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_17a8._56_8_;
    pmVar2->endFunction = local_17a8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_17a8._40_8_;
    pmVar2->textDataFunction = local_17a8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_17a8._24_8_;
    pmVar2->beginFunction = local_17a8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_17a8._8_8_;
    local_1878 = ColladaParserAutoGen14Private::_begin__param;
    local_1870 = 0;
    local_1888 = ColladaParserAutoGen14Private::_data__param;
    local_1880 = 0;
    local_1898 = ColladaParserAutoGen14Private::_end__param;
    uStack_1890 = 0;
    local_18a8 = ColladaParserAutoGen14Private::_preBegin__param;
    uStack_18a0 = 0;
    local_18b8 = ColladaParserAutoGen14Private::_preEnd__param;
    uStack_18b0 = 0;
    local_18c8 = ColladaParserAutoGen14Private::_freeAttributes__param;
    uStack_18c0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_1868,0x850b20,0,0x85f1e0,0,(ElementValidateEndFunctionPtr)pcVar3,0x850b50);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,in_stack_ffffffffffffe0b8);
    pmVar2->freeAttributesFunction = local_1868.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1868._88_8_;
    pmVar2->validateEndFunction = local_1868.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1868._72_8_;
    pmVar2->validateBeginFunction = local_1868.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1868._56_8_;
    pmVar2->endFunction = local_1868.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1868._40_8_;
    pmVar2->textDataFunction = local_1868.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1868._24_8_;
    pmVar2->beginFunction = local_1868.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1868._8_8_;
    local_1938 = ColladaParserAutoGen14Private::_begin__input____InputLocal;
    local_1930 = 0;
    local_1948 = ColladaParserAutoGen14Private::_data__input____InputLocal;
    local_1940 = 0;
    local_1958 = ColladaParserAutoGen14Private::_end__input____InputLocal;
    uStack_1950 = 0;
    local_1968 = ColladaParserAutoGen14Private::_preBegin__input____InputLocal;
    uStack_1960 = 0;
    local_1978 = ColladaParserAutoGen14Private::_preEnd__input____InputLocal;
    uStack_1970 = 0;
    local_1988 = ColladaParserAutoGen14Private::_freeAttributes__input____InputLocal;
    uStack_1980 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_1928,0x8508a0,0,0x85f710,0,(ElementValidateEndFunctionPtr)pcVar3,0x8508d0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,in_stack_ffffffffffffe0b8);
    pmVar2->freeAttributesFunction = local_1928.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1928._88_8_;
    pmVar2->validateEndFunction = local_1928.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1928._72_8_;
    pmVar2->validateBeginFunction = local_1928.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1928._56_8_;
    pmVar2->endFunction = local_1928.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1928._40_8_;
    pmVar2->textDataFunction = local_1928.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1928._24_8_;
    pmVar2->beginFunction = local_1928.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1928._8_8_;
    local_19f8 = ColladaParserAutoGen14Private::_begin__bind_shape_matrix;
    local_19f0 = 0;
    local_1a08 = ColladaParserAutoGen14Private::_data__bind_shape_matrix;
    local_1a00 = 0;
    local_1a18 = ColladaParserAutoGen14Private::_end__bind_shape_matrix;
    uStack_1a10 = 0;
    local_1a28 = ColladaParserAutoGen14Private::_preBegin__bind_shape_matrix;
    uStack_1a20 = 0;
    local_1a38 = ColladaParserAutoGen14Private::_preEnd__bind_shape_matrix;
    uStack_1a30 = 0;
    local_1a48 = ColladaParserAutoGen14Private::_freeAttributes__bind_shape_matrix;
    uStack_1a40 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_19e8,0x850e90,0,0x8625e0,0,(ElementValidateEndFunctionPtr)pcVar3,0x850ec0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,in_stack_ffffffffffffe0b8);
    pmVar2->freeAttributesFunction = local_19e8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_19e8._88_8_;
    pmVar2->validateEndFunction = local_19e8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_19e8._72_8_;
    pmVar2->validateBeginFunction = local_19e8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_19e8._56_8_;
    pmVar2->endFunction = local_19e8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_19e8._40_8_;
    pmVar2->textDataFunction = local_19e8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_19e8._24_8_;
    pmVar2->beginFunction = local_19e8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_19e8._8_8_;
    local_1ab8 = ColladaParserAutoGen14Private::_begin__joints;
    local_1ab0 = 0;
    local_1ac8 = ColladaParserAutoGen14Private::_data__joints;
    local_1ac0 = 0;
    local_1ad8 = ColladaParserAutoGen14Private::_end__joints;
    uStack_1ad0 = 0;
    local_1ae8 = ColladaParserAutoGen14Private::_preBegin__joints;
    uStack_1ae0 = 0;
    local_1af8 = ColladaParserAutoGen14Private::_preEnd__joints;
    uStack_1af0 = 0;
    local_1b08 = ColladaParserAutoGen14Private::_freeAttributes__joints;
    uStack_1b00 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_1aa8,0x84edc0,0,0x8626a0,0,(ElementValidateEndFunctionPtr)pcVar3,0x84edf0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,in_stack_ffffffffffffe0b8);
    pmVar2->freeAttributesFunction = local_1aa8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1aa8._88_8_;
    pmVar2->validateEndFunction = local_1aa8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1aa8._72_8_;
    pmVar2->validateBeginFunction = local_1aa8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1aa8._56_8_;
    pmVar2->endFunction = local_1aa8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1aa8._40_8_;
    pmVar2->textDataFunction = local_1aa8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1aa8._24_8_;
    pmVar2->beginFunction = local_1aa8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1aa8._8_8_;
    local_1b78 = ColladaParserAutoGen14Private::_begin__vertex_weights;
    local_1b70 = 0;
    local_1b88 = ColladaParserAutoGen14Private::_data__vertex_weights;
    local_1b80 = 0;
    local_1b98 = ColladaParserAutoGen14Private::_end__vertex_weights;
    uStack_1b90 = 0;
    local_1ba8 = ColladaParserAutoGen14Private::_preBegin__vertex_weights;
    uStack_1ba0 = 0;
    local_1bb8 = ColladaParserAutoGen14Private::_preEnd__vertex_weights;
    uStack_1bb0 = 0;
    local_1bc8 = ColladaParserAutoGen14Private::_freeAttributes__vertex_weights;
    uStack_1bc0 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_1b68,0x850260,0,0x862700,0,(ElementValidateEndFunctionPtr)pcVar3,0x850290);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,in_stack_ffffffffffffe0b8);
    pcVar3 = ColladaParserAutoGen14Private::_preBegin__input____InputLocal;
    pmVar2->freeAttributesFunction = local_1b68.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1b68._88_8_;
    pmVar2->validateEndFunction = local_1b68.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1b68._72_8_;
    pmVar2->validateBeginFunction = local_1b68.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1b68._56_8_;
    pmVar2->endFunction = local_1b68.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1b68._40_8_;
    pmVar2->textDataFunction = local_1b68.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1b68._24_8_;
    pmVar2->beginFunction = local_1b68.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1b68._8_8_;
    local_1c38 = ColladaParserAutoGen14Private::_begin__input____InputLocal;
    local_1c30 = 0;
    local_1c48 = ColladaParserAutoGen14Private::_data__input____InputLocal;
    local_1c40 = 0;
    local_1c58 = ColladaParserAutoGen14Private::_end__input____InputLocal;
    uStack_1c50 = 0;
    local_1c68 = ColladaParserAutoGen14Private::_preBegin__input____InputLocal;
    uStack_1c60 = 0;
    local_1c78 = ColladaParserAutoGen14Private::_preEnd__input____InputLocal;
    uStack_1c70 = 0;
    local_1c88 = ColladaParserAutoGen14Private::_freeAttributes__input____InputLocal;
    uStack_1c80 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_1c28,0x8508a0,0,0x85f710,0,0x85f730,0x8508d0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,in_stack_ffffffffffffe0b8);
    pmVar2->freeAttributesFunction = local_1c28.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1c28._88_8_;
    pmVar2->validateEndFunction = local_1c28.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1c28._72_8_;
    pmVar2->validateBeginFunction = local_1c28.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1c28._56_8_;
    pmVar2->endFunction = local_1c28.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1c28._40_8_;
    pmVar2->textDataFunction = local_1c28.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1c28._24_8_;
    pmVar2->beginFunction = local_1c28.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1c28._8_8_;
    local_1cf8 = ColladaParserAutoGen14Private::_begin__input____InputLocalOffset;
    local_1cf0 = 0;
    local_1d08 = ColladaParserAutoGen14Private::_data__input____InputLocalOffset;
    local_1d00 = 0;
    local_1d18 = ColladaParserAutoGen14Private::_end__input____InputLocalOffset;
    uStack_1d10 = 0;
    local_1d28 = ColladaParserAutoGen14Private::_preBegin__input____InputLocalOffset;
    uStack_1d20 = 0;
    local_1d38 = ColladaParserAutoGen14Private::_preEnd__input____InputLocalOffset;
    uStack_1d30 = 0;
    local_1d48 = ColladaParserAutoGen14Private::_freeAttributes__input____InputLocalOffset;
    uStack_1d40 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_1ce8,0x850ee0,0,0x862900,0,(ElementValidateEndFunctionPtr)pcVar3,0x850f10);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,in_stack_ffffffffffffe0b8);
    pmVar2->freeAttributesFunction = local_1ce8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1ce8._88_8_;
    pmVar2->validateEndFunction = local_1ce8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1ce8._72_8_;
    pmVar2->validateBeginFunction = local_1ce8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1ce8._56_8_;
    pmVar2->endFunction = local_1ce8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1ce8._40_8_;
    pmVar2->textDataFunction = local_1ce8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1ce8._24_8_;
    pmVar2->beginFunction = local_1ce8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1ce8._8_8_;
    local_1db8 = ColladaParserAutoGen14Private::_begin__v;
    local_1db0 = 0;
    local_1dc8 = ColladaParserAutoGen14Private::_data__v;
    local_1dc0 = 0;
    local_1dd8 = ColladaParserAutoGen14Private::_end__v;
    uStack_1dd0 = 0;
    local_1de8 = ColladaParserAutoGen14Private::_preBegin__v;
    uStack_1de0 = 0;
    local_1df8 = ColladaParserAutoGen14Private::_preEnd__v;
    uStack_1df0 = 0;
    local_1e08 = ColladaParserAutoGen14Private::_freeAttributes__v;
    uStack_1e00 = 0;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct
              (&local_1da8,0x850f30,0,0x862d10,0,(ElementValidateEndFunctionPtr)pcVar3,0x850f60);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,in_stack_ffffffffffffe0b8);
    pmVar2->freeAttributesFunction = local_1da8.freeAttributesFunction;
    *(undefined8 *)&pmVar2->field_0x58 = local_1da8._88_8_;
    pmVar2->validateEndFunction = local_1da8.validateEndFunction;
    *(undefined8 *)&pmVar2->field_0x48 = local_1da8._72_8_;
    pmVar2->validateBeginFunction = local_1da8.validateBeginFunction;
    *(undefined8 *)&pmVar2->field_0x38 = local_1da8._56_8_;
    pmVar2->endFunction = local_1da8.endFunction;
    *(undefined8 *)&pmVar2->field_0x28 = local_1da8._40_8_;
    pmVar2->textDataFunction = local_1da8.textDataFunction;
    *(undefined8 *)&pmVar2->field_0x18 = local_1da8._24_8_;
    pmVar2->beginFunction = local_1da8.beginFunction;
    *(undefined8 *)&pmVar2->field_0x8 = local_1da8._8_8_;
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ::FunctionStruct::FunctionStruct(&local_1e68,0x850f80,0,0x862c50,0,0x862d00,0x850fb0);
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
             ::operator[]((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                           *)this,in_stack_ffffffffffffe0b8);
    memcpy(pmVar2,&local_1e68,0x60);
    createFunctionMap__library_controllers__allChildren::mapFilled = true;
  }
  return &createFunctionMap__library_controllers__allChildren::functionMap;
}

Assistant:

const ColladaParserAutoGen14Private::ElementFunctionMap& FunctionMapFactory::createFunctionMap__library_controllers__allChildren() {
static ColladaParserAutoGen14Private::ElementFunctionMap functionMap;
static bool mapFilled = false;
if ( !mapFilled )
{
functionMap[HASH_ELEMENT_COLLADA] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__COLLADA, &ColladaParserAutoGen14Private::_data__COLLADA, &ColladaParserAutoGen14Private::_end__COLLADA, &ColladaParserAutoGen14Private::_preBegin__COLLADA, &ColladaParserAutoGen14Private::_preEnd__COLLADA, &ColladaParserAutoGen14Private::_freeAttributes__COLLADA);
functionMap[HASH_ELEMENT_LIBRARY_CONTROLLERS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__library_controllers, &ColladaParserAutoGen14Private::_data__library_controllers, &ColladaParserAutoGen14Private::_end__library_controllers, &ColladaParserAutoGen14Private::_preBegin__library_controllers, &ColladaParserAutoGen14Private::_preEnd__library_controllers, &ColladaParserAutoGen14Private::_freeAttributes__library_controllers);
functionMap[HASH_ELEMENT_ASSET] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__asset, &ColladaParserAutoGen14Private::_data__asset, &ColladaParserAutoGen14Private::_end__asset, &ColladaParserAutoGen14Private::_preBegin__asset, &ColladaParserAutoGen14Private::_preEnd__asset, &ColladaParserAutoGen14Private::_freeAttributes__asset);
functionMap[HASH_ELEMENT_CONTROLLER] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__controller, &ColladaParserAutoGen14Private::_data__controller, &ColladaParserAutoGen14Private::_end__controller, &ColladaParserAutoGen14Private::_preBegin__controller, &ColladaParserAutoGen14Private::_preEnd__controller, &ColladaParserAutoGen14Private::_freeAttributes__controller);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__extra, &ColladaParserAutoGen14Private::_data__extra, &ColladaParserAutoGen14Private::_end__extra, &ColladaParserAutoGen14Private::_preBegin__extra, &ColladaParserAutoGen14Private::_preEnd__extra, &ColladaParserAutoGen14Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_CONTRIBUTOR] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__contributor, &ColladaParserAutoGen14Private::_data__contributor, &ColladaParserAutoGen14Private::_end__contributor, &ColladaParserAutoGen14Private::_preBegin__contributor, &ColladaParserAutoGen14Private::_preEnd__contributor, &ColladaParserAutoGen14Private::_freeAttributes__contributor);
functionMap[HASH_ELEMENT_CREATED] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__created, &ColladaParserAutoGen14Private::_data__created, &ColladaParserAutoGen14Private::_end__created, &ColladaParserAutoGen14Private::_preBegin__created, &ColladaParserAutoGen14Private::_preEnd__created, &ColladaParserAutoGen14Private::_freeAttributes__created);
functionMap[HASH_ELEMENT_KEYWORDS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__keywords, &ColladaParserAutoGen14Private::_data__keywords, &ColladaParserAutoGen14Private::_end__keywords, &ColladaParserAutoGen14Private::_preBegin__keywords, &ColladaParserAutoGen14Private::_preEnd__keywords, &ColladaParserAutoGen14Private::_freeAttributes__keywords);
functionMap[HASH_ELEMENT_MODIFIED] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__modified, &ColladaParserAutoGen14Private::_data__modified, &ColladaParserAutoGen14Private::_end__modified, &ColladaParserAutoGen14Private::_preBegin__modified, &ColladaParserAutoGen14Private::_preEnd__modified, &ColladaParserAutoGen14Private::_freeAttributes__modified);
functionMap[HASH_ELEMENT_REVISION] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__revision, &ColladaParserAutoGen14Private::_data__revision, &ColladaParserAutoGen14Private::_end__revision, &ColladaParserAutoGen14Private::_preBegin__revision, &ColladaParserAutoGen14Private::_preEnd__revision, &ColladaParserAutoGen14Private::_freeAttributes__revision);
functionMap[HASH_ELEMENT_SUBJECT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__subject, &ColladaParserAutoGen14Private::_data__subject, &ColladaParserAutoGen14Private::_end__subject, &ColladaParserAutoGen14Private::_preBegin__subject, &ColladaParserAutoGen14Private::_preEnd__subject, &ColladaParserAutoGen14Private::_freeAttributes__subject);
functionMap[HASH_ELEMENT_TITLE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__title, &ColladaParserAutoGen14Private::_data__title, &ColladaParserAutoGen14Private::_end__title, &ColladaParserAutoGen14Private::_preBegin__title, &ColladaParserAutoGen14Private::_preEnd__title, &ColladaParserAutoGen14Private::_freeAttributes__title);
functionMap[HASH_ELEMENT_UNIT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__unit, &ColladaParserAutoGen14Private::_data__unit, &ColladaParserAutoGen14Private::_end__unit, &ColladaParserAutoGen14Private::_preBegin__unit, &ColladaParserAutoGen14Private::_preEnd__unit, &ColladaParserAutoGen14Private::_freeAttributes__unit);
functionMap[HASH_ELEMENT_UP_AXIS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__up_axis, &ColladaParserAutoGen14Private::_data__up_axis, &ColladaParserAutoGen14Private::_end__up_axis, &ColladaParserAutoGen14Private::_preBegin__up_axis, &ColladaParserAutoGen14Private::_preEnd__up_axis, &ColladaParserAutoGen14Private::_freeAttributes__up_axis);
functionMap[HASH_ELEMENT_AUTHOR] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__author, &ColladaParserAutoGen14Private::_data__author, &ColladaParserAutoGen14Private::_end__author, &ColladaParserAutoGen14Private::_preBegin__author, &ColladaParserAutoGen14Private::_preEnd__author, &ColladaParserAutoGen14Private::_freeAttributes__author);
functionMap[HASH_ELEMENT_AUTHORING_TOOL] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__authoring_tool, &ColladaParserAutoGen14Private::_data__authoring_tool, &ColladaParserAutoGen14Private::_end__authoring_tool, &ColladaParserAutoGen14Private::_preBegin__authoring_tool, &ColladaParserAutoGen14Private::_preEnd__authoring_tool, &ColladaParserAutoGen14Private::_freeAttributes__authoring_tool);
functionMap[HASH_ELEMENT_COMMENTS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__comments, &ColladaParserAutoGen14Private::_data__comments, &ColladaParserAutoGen14Private::_end__comments, &ColladaParserAutoGen14Private::_preBegin__comments, &ColladaParserAutoGen14Private::_preEnd__comments, &ColladaParserAutoGen14Private::_freeAttributes__comments);
functionMap[HASH_ELEMENT_COPYRIGHT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__copyright, &ColladaParserAutoGen14Private::_data__copyright, &ColladaParserAutoGen14Private::_end__copyright, &ColladaParserAutoGen14Private::_preBegin__copyright, &ColladaParserAutoGen14Private::_preEnd__copyright, &ColladaParserAutoGen14Private::_freeAttributes__copyright);
functionMap[HASH_ELEMENT_SOURCE_DATA] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__source_data, &ColladaParserAutoGen14Private::_data__source_data, &ColladaParserAutoGen14Private::_end__source_data, &ColladaParserAutoGen14Private::_preBegin__source_data, &ColladaParserAutoGen14Private::_preEnd__source_data, &ColladaParserAutoGen14Private::_freeAttributes__source_data);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__extra, &ColladaParserAutoGen14Private::_data__extra, &ColladaParserAutoGen14Private::_end__extra, &ColladaParserAutoGen14Private::_preBegin__extra, &ColladaParserAutoGen14Private::_preEnd__extra, &ColladaParserAutoGen14Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_MORPH] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__morph, &ColladaParserAutoGen14Private::_data__morph, &ColladaParserAutoGen14Private::_end__morph, &ColladaParserAutoGen14Private::_preBegin__morph, &ColladaParserAutoGen14Private::_preEnd__morph, &ColladaParserAutoGen14Private::_freeAttributes__morph);
functionMap[HASH_ELEMENT_SKIN] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__skin, &ColladaParserAutoGen14Private::_data__skin, &ColladaParserAutoGen14Private::_end__skin, &ColladaParserAutoGen14Private::_preBegin__skin, &ColladaParserAutoGen14Private::_preEnd__skin, &ColladaParserAutoGen14Private::_freeAttributes__skin);
functionMap[HASH_ELEMENT_TECHNIQUE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__technique, &ColladaParserAutoGen14Private::_data__technique, &ColladaParserAutoGen14Private::_end__technique, &ColladaParserAutoGen14Private::_preBegin__technique, &ColladaParserAutoGen14Private::_preEnd__technique, &ColladaParserAutoGen14Private::_freeAttributes__technique);
functionMap[HASH_ELEMENT_SOURCE] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__source, &ColladaParserAutoGen14Private::_data__source, &ColladaParserAutoGen14Private::_end__source, &ColladaParserAutoGen14Private::_preBegin__source, &ColladaParserAutoGen14Private::_preEnd__source, &ColladaParserAutoGen14Private::_freeAttributes__source);
functionMap[HASH_ELEMENT_TARGETS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__targets, &ColladaParserAutoGen14Private::_data__targets, &ColladaParserAutoGen14Private::_end__targets, &ColladaParserAutoGen14Private::_preBegin__targets, &ColladaParserAutoGen14Private::_preEnd__targets, &ColladaParserAutoGen14Private::_freeAttributes__targets);
functionMap[HASH_ELEMENT_IDREF_ARRAY] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__IDREF_array, &ColladaParserAutoGen14Private::_data__IDREF_array, &ColladaParserAutoGen14Private::_end__IDREF_array, &ColladaParserAutoGen14Private::_preBegin__IDREF_array, &ColladaParserAutoGen14Private::_preEnd__IDREF_array, &ColladaParserAutoGen14Private::_freeAttributes__IDREF_array);
functionMap[HASH_ELEMENT_NAME_ARRAY] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__Name_array, &ColladaParserAutoGen14Private::_data__Name_array, &ColladaParserAutoGen14Private::_end__Name_array, &ColladaParserAutoGen14Private::_preBegin__Name_array, &ColladaParserAutoGen14Private::_preEnd__Name_array, &ColladaParserAutoGen14Private::_freeAttributes__Name_array);
functionMap[HASH_ELEMENT_BOOL_ARRAY] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__bool_array, &ColladaParserAutoGen14Private::_data__bool_array, &ColladaParserAutoGen14Private::_end__bool_array, &ColladaParserAutoGen14Private::_preBegin__bool_array, &ColladaParserAutoGen14Private::_preEnd__bool_array, &ColladaParserAutoGen14Private::_freeAttributes__bool_array);
functionMap[HASH_ELEMENT_FLOAT_ARRAY] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__float_array, &ColladaParserAutoGen14Private::_data__float_array, &ColladaParserAutoGen14Private::_end__float_array, &ColladaParserAutoGen14Private::_preBegin__float_array, &ColladaParserAutoGen14Private::_preEnd__float_array, &ColladaParserAutoGen14Private::_freeAttributes__float_array);
functionMap[HASH_ELEMENT_INT_ARRAY] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__int_array, &ColladaParserAutoGen14Private::_data__int_array, &ColladaParserAutoGen14Private::_end__int_array, &ColladaParserAutoGen14Private::_preBegin__int_array, &ColladaParserAutoGen14Private::_preEnd__int_array, &ColladaParserAutoGen14Private::_freeAttributes__int_array);
functionMap[HASH_ELEMENT_ANIMATION__SOURCE__TECHNIQUE_COMMON] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__animation__source__technique_common, &ColladaParserAutoGen14Private::_data__animation__source__technique_common, &ColladaParserAutoGen14Private::_end__animation__source__technique_common, &ColladaParserAutoGen14Private::_preBegin__animation__source__technique_common, &ColladaParserAutoGen14Private::_preEnd__animation__source__technique_common, &ColladaParserAutoGen14Private::_freeAttributes__animation__source__technique_common);
functionMap[HASH_ELEMENT_ACCESSOR] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__accessor, &ColladaParserAutoGen14Private::_data__accessor, &ColladaParserAutoGen14Private::_end__accessor, &ColladaParserAutoGen14Private::_preBegin__accessor, &ColladaParserAutoGen14Private::_preEnd__accessor, &ColladaParserAutoGen14Private::_freeAttributes__accessor);
functionMap[HASH_ELEMENT_PARAM] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__param, &ColladaParserAutoGen14Private::_data__param, &ColladaParserAutoGen14Private::_end__param, &ColladaParserAutoGen14Private::_preBegin__param, &ColladaParserAutoGen14Private::_preEnd__param, &ColladaParserAutoGen14Private::_freeAttributes__param);
functionMap[HASH_ELEMENT_INPUT____INPUTLOCAL] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__input____InputLocal, &ColladaParserAutoGen14Private::_data__input____InputLocal, &ColladaParserAutoGen14Private::_end__input____InputLocal, &ColladaParserAutoGen14Private::_preBegin__input____InputLocal, &ColladaParserAutoGen14Private::_preEnd__input____InputLocal, &ColladaParserAutoGen14Private::_freeAttributes__input____InputLocal);
functionMap[HASH_ELEMENT_BIND_SHAPE_MATRIX] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__bind_shape_matrix, &ColladaParserAutoGen14Private::_data__bind_shape_matrix, &ColladaParserAutoGen14Private::_end__bind_shape_matrix, &ColladaParserAutoGen14Private::_preBegin__bind_shape_matrix, &ColladaParserAutoGen14Private::_preEnd__bind_shape_matrix, &ColladaParserAutoGen14Private::_freeAttributes__bind_shape_matrix);
functionMap[HASH_ELEMENT_JOINTS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__joints, &ColladaParserAutoGen14Private::_data__joints, &ColladaParserAutoGen14Private::_end__joints, &ColladaParserAutoGen14Private::_preBegin__joints, &ColladaParserAutoGen14Private::_preEnd__joints, &ColladaParserAutoGen14Private::_freeAttributes__joints);
functionMap[HASH_ELEMENT_VERTEX_WEIGHTS] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__vertex_weights, &ColladaParserAutoGen14Private::_data__vertex_weights, &ColladaParserAutoGen14Private::_end__vertex_weights, &ColladaParserAutoGen14Private::_preBegin__vertex_weights, &ColladaParserAutoGen14Private::_preEnd__vertex_weights, &ColladaParserAutoGen14Private::_freeAttributes__vertex_weights);
functionMap[HASH_ELEMENT_INPUT____INPUTLOCAL] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__input____InputLocal, &ColladaParserAutoGen14Private::_data__input____InputLocal, &ColladaParserAutoGen14Private::_end__input____InputLocal, &ColladaParserAutoGen14Private::_preBegin__input____InputLocal, &ColladaParserAutoGen14Private::_preEnd__input____InputLocal, &ColladaParserAutoGen14Private::_freeAttributes__input____InputLocal);
functionMap[HASH_ELEMENT_INPUT____INPUTLOCALOFFSET] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__input____InputLocalOffset, &ColladaParserAutoGen14Private::_data__input____InputLocalOffset, &ColladaParserAutoGen14Private::_end__input____InputLocalOffset, &ColladaParserAutoGen14Private::_preBegin__input____InputLocalOffset, &ColladaParserAutoGen14Private::_preEnd__input____InputLocalOffset, &ColladaParserAutoGen14Private::_freeAttributes__input____InputLocalOffset);
functionMap[HASH_ELEMENT_V] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__v, &ColladaParserAutoGen14Private::_data__v, &ColladaParserAutoGen14Private::_end__v, &ColladaParserAutoGen14Private::_preBegin__v, &ColladaParserAutoGen14Private::_preEnd__v, &ColladaParserAutoGen14Private::_freeAttributes__v);
functionMap[HASH_ELEMENT_VCOUNT] = ColladaParserAutoGen14Private::FunctionStruct(&ColladaParserAutoGen14Private::_begin__vcount, &ColladaParserAutoGen14Private::_data__vcount, &ColladaParserAutoGen14Private::_end__vcount, &ColladaParserAutoGen14Private::_preBegin__vcount, &ColladaParserAutoGen14Private::_preEnd__vcount, &ColladaParserAutoGen14Private::_freeAttributes__vcount);
mapFilled = true;
}
return functionMap;
}